

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O1

parser_error parse_p_race_values(parser *p)

{
  errr eVar1;
  parser_error pVar2;
  char *pcVar3;
  wchar_t index;
  wchar_t value;
  int local_48;
  int local_44;
  char *local_40;
  void *local_38;
  
  local_38 = parser_priv(p);
  if (local_38 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"values");
    local_40 = string_make(pcVar3);
    pcVar3 = strtok(local_40," |");
    while (pcVar3 != (char *)0x0) {
      local_44 = 0;
      local_48 = 0;
      eVar1 = grab_index_and_int(&local_44,&local_48,list_element_names,"RES_",pcVar3);
      if (eVar1 != 0) goto LAB_0015f7d7;
      *(undefined2 *)((long)local_38 + (long)local_48 * 4 + 0x88) = (undefined2)local_44;
      pcVar3 = strtok((char *)0x0," |");
    }
    pcVar3 = (char *)0x0;
LAB_0015f7d7:
    string_free(local_40);
    pVar2 = PARSE_ERROR_INVALID_VALUE;
    if (pcVar3 == (char *)0x0) {
      pVar2 = PARSE_ERROR_NONE;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_p_race_values(struct parser *p) {
	struct player_race *r = parser_priv(p);
	char *s;
	char *t;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = string_make(parser_getstr(p, "values"));
	t = strtok(s, " |");

	while (t) {
		int value = 0;
		int index = 0;
		bool found = false;
		if (!grab_index_and_int(&value, &index, list_element_names, "RES_", t)) {
			found = true;
			r->el_info[index].res_level = value;
		}
		if (!found)
			break;

		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}